

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

void aom_get_var_sse_sum_8x8_quad_sse2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint32_t *sse8x8,
               int *sum8x8,uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [13];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  int i;
  ulong *puVar27;
  ulong *puVar28;
  int k;
  long lVar29;
  uint32_t *sse;
  int *sum;
  bool bVar30;
  undefined1 auVar31 [16];
  __m128i vsse;
  __m128i vsum;
  
  sse = sse8x8;
  sum = sum8x8;
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    vsum[1]._0_4_ = 8;
    puVar27 = (ulong *)src_ptr;
    puVar28 = (ulong *)ref_ptr;
    while( true ) {
      bVar30 = (int)vsum[1] == 0;
      vsum[1]._0_4_ = (int)vsum[1] + -1;
      if (bVar30) break;
      uVar1 = *puVar27;
      auVar4._8_6_ = 0;
      auVar4._0_8_ = uVar1;
      auVar4[0xe] = (char)(uVar1 >> 0x38);
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar1;
      auVar6[0xc] = (char)(uVar1 >> 0x30);
      auVar6._13_2_ = auVar4._13_2_;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar1;
      auVar8._12_3_ = auVar6._12_3_;
      auVar10._8_2_ = 0;
      auVar10._0_8_ = uVar1;
      auVar10[10] = (char)(uVar1 >> 0x28);
      auVar10._11_4_ = auVar8._11_4_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar1;
      auVar12._10_5_ = auVar10._10_5_;
      auVar14[8] = (char)(uVar1 >> 0x20);
      auVar14._0_8_ = uVar1;
      auVar14._9_6_ = auVar12._9_6_;
      auVar15._7_8_ = 0;
      auVar15._0_7_ = auVar14._8_7_;
      Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),(char)(uVar1 >> 0x18));
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var16;
      auVar17._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar17[0] = (char)(uVar1 >> 0x10);
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar17;
      auVar18._1_12_ = SUB1512(auVar24 << 0x20,3);
      auVar18[0] = (char)(uVar1 >> 8);
      uVar2 = *puVar28;
      auVar3._8_6_ = 0;
      auVar3._0_8_ = uVar2;
      auVar3[0xe] = (char)(uVar2 >> 0x38);
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar2;
      auVar5[0xc] = (char)(uVar2 >> 0x30);
      auVar5._13_2_ = auVar3._13_2_;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar2;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9._8_2_ = 0;
      auVar9._0_8_ = uVar2;
      auVar9[10] = (char)(uVar2 >> 0x28);
      auVar9._11_4_ = auVar7._11_4_;
      auVar11._8_2_ = 0;
      auVar11._0_8_ = uVar2;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = (char)(uVar2 >> 0x20);
      auVar13._0_8_ = uVar2;
      auVar13._9_6_ = auVar11._9_6_;
      auVar19._7_8_ = 0;
      auVar19._0_7_ = auVar13._8_7_;
      Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var20;
      auVar21._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar21[0] = (char)(uVar2 >> 0x10);
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar21;
      auVar22._1_12_ = SUB1512(auVar26 << 0x20,3);
      auVar22[0] = (char)(uVar2 >> 8);
      auVar31._0_2_ = (ushort)(byte)uVar1 - (ushort)(byte)uVar2;
      auVar31._2_2_ = auVar18._0_2_ - auVar22._0_2_;
      auVar31._4_2_ = auVar17._0_2_ - auVar21._0_2_;
      auVar31._6_2_ = (short)Var16 - (short)Var20;
      auVar31._8_2_ = auVar14._8_2_ - auVar13._8_2_;
      auVar31._10_2_ = auVar10._10_2_ - auVar9._10_2_;
      auVar31._12_2_ = auVar6._12_2_ - auVar5._12_2_;
      auVar31._14_2_ = (auVar4._13_2_ >> 8) - (auVar3._13_2_ >> 8);
      pmaddwd(auVar31,auVar31);
      puVar28 = (ulong *)((long)puVar28 + (long)ref_stride);
      puVar27 = (ulong *)((long)puVar27 + (long)src_stride);
    }
    vsse[1] = (longlong)(sum8x8 + lVar29);
    vsse[0] = (longlong)(sse8x8 + lVar29);
    vsum[0] = (longlong)puVar28;
    vsum[1]._4_4_ = 0;
    variance_final_128_pel_sse2(vsse,vsum,sse,sum);
    ref_ptr = (uint8_t *)((long)ref_ptr + 8);
    src_ptr = (uint8_t *)((long)src_ptr + 8);
  }
  *tot_sse = *tot_sse + sse8x8[3] + sse8x8[1] + sse8x8[2] + *sse8x8;
  *tot_sum = *tot_sum + sum8x8[3] + sum8x8[1] + sum8x8[2] + *sum8x8;
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    var8x8[lVar29] =
         sse8x8[lVar29] - (int)((ulong)((long)sum8x8[lVar29] * (long)sum8x8[lVar29]) >> 6);
  }
  return;
}

Assistant:

void aom_get_var_sse_sum_8x8_quad_sse2(const uint8_t *src_ptr, int src_stride,
                                       const uint8_t *ref_ptr, int ref_stride,
                                       uint32_t *sse8x8, int *sum8x8,
                                       unsigned int *tot_sse, int *tot_sum,
                                       uint32_t *var8x8) {
  // Loop over 4 8x8 blocks. Process one 8x32 block.
  for (int k = 0; k < 4; k++) {
    const uint8_t *src = src_ptr;
    const uint8_t *ref = ref_ptr;
    __m128i vsum = _mm_setzero_si128();
    __m128i vsse = _mm_setzero_si128();
    for (int i = 0; i < 8; i++) {
      const __m128i s = load8_8to16_sse2(src + (k * 8));
      const __m128i r = load8_8to16_sse2(ref + (k * 8));
      const __m128i diff = _mm_sub_epi16(s, r);
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff, diff));
      vsum = _mm_add_epi16(vsum, diff);

      src += src_stride;
      ref += ref_stride;
    }
    variance_final_128_pel_sse2(vsse, vsum, &sse8x8[k], &sum8x8[k]);
  }

  // Calculate variance at 8x8 level and total sse, sum of 8x32 block.
  *tot_sse += sse8x8[0] + sse8x8[1] + sse8x8[2] + sse8x8[3];
  *tot_sum += sum8x8[0] + sum8x8[1] + sum8x8[2] + sum8x8[3];
  for (int i = 0; i < 4; i++)
    var8x8[i] = sse8x8[i] - (uint32_t)(((int64_t)sum8x8[i] * sum8x8[i]) >> 6);
}